

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3SqlExec(int *pRC,Fts3Table *p,int eStmt,sqlite3_value **apVal)

{
  int iVar1;
  sqlite3_stmt *in_RAX;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_18;
  
  if (*pRC != 0) {
    return;
  }
  local_18 = in_RAX;
  iVar1 = fts3SqlStmt(p,eStmt,&local_18,apVal);
  if (iVar1 == 0) {
    sqlite3_step(local_18);
    iVar1 = sqlite3_reset(local_18);
  }
  *pRC = iVar1;
  return;
}

Assistant:

static void fts3SqlExec(
  int *pRC,                /* Result code */
  Fts3Table *p,            /* The FTS3 table */
  int eStmt,               /* Index of statement to evaluate */
  sqlite3_value **apVal    /* Parameters to bind */
){
  sqlite3_stmt *pStmt;
  int rc;
  if( *pRC ) return;
  rc = fts3SqlStmt(p, eStmt, &pStmt, apVal); 
  if( rc==SQLITE_OK ){
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
  }
  *pRC = rc;
}